

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

unsigned_long tjBufSizeYUV2(int width,int pad,int height,int subsamp)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  unsigned_long uVar4;
  uint componentID;
  bool bVar5;
  
  if ((uint)subsamp < 6) {
    uVar4 = 0;
    componentID = 0;
    do {
      iVar1 = tjPlaneWidth(componentID,width,subsamp);
      uVar2 = tjPlaneHeight(componentID,height,subsamp);
      if (iVar1 < 0) {
        return 0xffffffffffffffff;
      }
      if ((int)uVar2 < 0) {
        return 0xffffffffffffffff;
      }
      uVar4 = uVar4 + (ulong)uVar2 * (long)(iVar1 + pad + -1 & -pad);
      if (subsamp == 3) {
        return uVar4;
      }
      bVar5 = componentID < 2;
      componentID = componentID + 1;
    } while (bVar5);
  }
  else {
    pcVar3 = (char *)__tls_get_addr(&PTR_0019ef20);
    builtin_strncpy(pcVar3,"tjBufSizeYUV2(): Invalid argument",0x22);
    uVar4 = 0xffffffffffffffff;
  }
  return uVar4;
}

Assistant:

DLLEXPORT unsigned long tjBufSizeYUV2(int width, int pad, int height,
                                      int subsamp)
{
  unsigned long long retval = 0;
  int nc, i;

  if (subsamp < 0 || subsamp >= NUMSUBOPT)
    THROWG("tjBufSizeYUV2(): Invalid argument");

  nc = (subsamp == TJSAMP_GRAY ? 1 : 3);
  for (i = 0; i < nc; i++) {
    int pw = tjPlaneWidth(i, width, subsamp);
    int stride = PAD(pw, pad);
    int ph = tjPlaneHeight(i, height, subsamp);

    if (pw < 0 || ph < 0) return -1;
    else retval += (unsigned long long)stride * ph;
  }
  if (retval > (unsigned long long)((unsigned long)-1))
    THROWG("tjBufSizeYUV2(): Image is too large");

bailout:
  return (unsigned long)retval;
}